

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.cpp
# Opt level: O0

UniValue *
wallet::ProcessImportLegacy
          (UniValue *__return_storage_ptr__,ImportData *import_data,
          map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
          *pubkey_map,
          map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
          *privkey_map,set<CScript,_std::less<CScript>,_std::allocator<CScript>_> *script_pub_keys,
          bool *have_solving_data,UniValue *data,
          vector<std::pair<CKeyID,_bool>,_std::allocator<std::pair<CKeyID,_bool>_>_>
          *ordered_pubkeys)

{
  long lVar1;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  last;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view hex_str;
  string_view hex_str_00;
  string_view hex_str_01;
  Span<const_unsigned_char> s;
  undefined1 uVar2;
  __optional_eq_t<OutputType,_OutputType> _Var3;
  VType VVar4;
  undefined8 uVar5;
  size_type sVar6;
  size_t sVar7;
  size_t sVar8;
  size_type sVar9;
  size_type sVar10;
  reference ppVar11;
  pointer ppVar12;
  long in_FS_OFFSET;
  bool bVar13;
  bool bVar14;
  pair<std::_Rb_tree_const_iterator<CScript>,_bool> pVar15;
  pair<std::_Rb_tree_iterator<std::pair<const_CKeyID,_CPubKey>_>,_bool> pVar16;
  pair<std::_Rb_tree_iterator<std::pair<const_CKeyID,_CKey>_>,_bool> pVar17;
  ImportData *in_stack_ffffffffffffef28;
  ImportData *in_stack_ffffffffffffef30;
  iterator in_stack_ffffffffffffef38;
  undefined4 in_stack_ffffffffffffef40;
  VType in_stack_ffffffffffffef44;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_ffffffffffffef48;
  iterator __position;
  _Rb_tree_iterator<std::pair<const_CKeyID,_bool>_> in_stack_ffffffffffffef50;
  _Rb_tree_iterator<std::pair<const_CKeyID,_bool>_> in_stack_ffffffffffffef58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffef60;
  UniValue *in_stack_ffffffffffffef68;
  UniValue *in_stack_ffffffffffffef70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffef78;
  int iVar18;
  bool local_107a;
  string *in_stack_ffffffffffffef90;
  char *in_stack_ffffffffffffef98;
  UniValue *in_stack_ffffffffffffefb0;
  string *in_stack_ffffffffffffefe0;
  CTxDestination *in_stack_fffffffffffff010;
  CScript *in_stack_fffffffffffff018;
  bool local_f32;
  bool local_efa;
  allocator<char> *in_stack_fffffffffffff118;
  ScriptContext script_ctx;
  undefined7 in_stack_fffffffffffff120;
  bool local_d72;
  byte local_d71;
  pair<const_CKeyID,_bool> *require_key;
  map<CKeyID,_bool,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_bool>_>_> *__range3;
  bool spendable;
  string *str;
  size_t i_1;
  size_t i;
  bool watchOnly;
  UniValue *keys;
  UniValue *pubKeys;
  string *witness_script_hex;
  string *strRedeemScript;
  string *output;
  bool isScript;
  UniValue *scriptPubKey;
  bool *have_solving_data_local;
  set<CScript,_std::less<CScript>,_std::allocator<CScript>_> *script_pub_keys_local;
  map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  *privkey_map_local;
  map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
  *pubkey_map_local;
  ImportData *import_data_local;
  UniValue *warnings;
  iterator key_data_it;
  _Self oldit_1;
  iterator it_1;
  _Self oldit;
  iterator it;
  iterator __end3;
  iterator __begin3;
  CKey key;
  vector<unsigned_char,_std::allocator<unsigned_char>_> parsed_witnessscript;
  vector<unsigned_char,_std::allocator<unsigned_char>_> parsed_redeemscript;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vData;
  allocator<char> local_a94;
  allocator<char> local_a93;
  allocator<char> local_a92;
  allocator<char> local_a91;
  allocator<char> local_a90;
  bool internal;
  allocator<char> local_a8e;
  allocator<char> local_a8d;
  allocator<char> local_a8c;
  allocator<char> local_a8b;
  allocator<char> local_a8a;
  allocator<char> local_a89;
  allocator<char> local_a88;
  allocator<char> local_a87;
  allocator<char> local_a86;
  allocator<char> local_a85;
  allocator<char> local_a84 [2];
  allocator<char> local_a82;
  allocator<char> local_a81;
  _Base_ptr local_a80;
  undefined1 local_a78;
  _Base_ptr local_a70;
  undefined1 local_a68;
  _Base_ptr local_a60;
  undefined1 local_a58;
  _Optional_payload_base<OutputType> local_a50;
  undefined1 local_888 [488];
  string error;
  CKeyID id;
  CPubKey pubkey_1;
  CPubKey pubkey;
  CTxDestination dest_1;
  CTxDestination dest;
  CScript script;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffef44,in_stack_ffffffffffffef40));
  UniValue::UniValue((UniValue *)in_stack_ffffffffffffef48._M_current,in_stack_ffffffffffffef44,
                     (string *)in_stack_ffffffffffffef38._M_node);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffef28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef78,(char *)in_stack_ffffffffffffef70,
             (allocator<char> *)in_stack_ffffffffffffef68);
  UniValue::operator[]
            ((UniValue *)in_stack_ffffffffffffef38._M_node,(string *)in_stack_ffffffffffffef30);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffef28);
  std::allocator<char>::~allocator(&local_a81);
  VVar4 = UniValue::getType((UniValue *)in_stack_ffffffffffffef28);
  bVar13 = VVar4 == VSTR;
  bVar14 = false;
  local_d71 = 0;
  if (!bVar13) {
    VVar4 = UniValue::getType((UniValue *)in_stack_ffffffffffffef28);
    bVar14 = VVar4 == VOBJ;
    local_d72 = false;
    if (bVar14) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffef78,(char *)in_stack_ffffffffffffef70,
                 (allocator<char> *)in_stack_ffffffffffffef68);
      local_d72 = UniValue::exists((UniValue *)in_stack_ffffffffffffef30,
                                   (string *)in_stack_ffffffffffffef28);
    }
    local_d71 = local_d72 ^ 0xff;
  }
  if (bVar14) {
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffef28);
    std::allocator<char>::~allocator(&local_a82);
  }
  if ((local_d71 & 1) == 0) {
    if (bVar13) {
      UniValue::get_str_abi_cxx11_((UniValue *)in_stack_ffffffffffffef30);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffef78,(char *)in_stack_ffffffffffffef70,
                 (allocator<char> *)in_stack_ffffffffffffef68);
      UniValue::operator[]
                ((UniValue *)in_stack_ffffffffffffef38._M_node,(string *)in_stack_ffffffffffffef30);
      UniValue::get_str_abi_cxx11_((UniValue *)in_stack_ffffffffffffef30);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffef28);
      std::allocator<char>::~allocator(local_a84);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffef78,(char *)in_stack_ffffffffffffef70,
               (allocator<char> *)in_stack_ffffffffffffef68);
    bVar14 = UniValue::exists((UniValue *)in_stack_ffffffffffffef30,
                              (string *)in_stack_ffffffffffffef28);
    if (bVar14) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffef78,(char *)in_stack_ffffffffffffef70,
                 (allocator<char> *)in_stack_ffffffffffffef68);
      UniValue::operator[]
                ((UniValue *)in_stack_ffffffffffffef38._M_node,(string *)in_stack_ffffffffffffef30);
      UniValue::get_str_abi_cxx11_((UniValue *)in_stack_ffffffffffffef30);
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffef70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffef68);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffef28);
      std::allocator<char>::~allocator(&local_a86);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffef78,(char *)in_stack_ffffffffffffef70,
                 (allocator<char> *)in_stack_ffffffffffffef68);
      std::allocator<char>::~allocator(&local_a87);
    }
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffef28);
    std::allocator<char>::~allocator(&local_a85);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffef78,(char *)in_stack_ffffffffffffef70,
               (allocator<char> *)in_stack_ffffffffffffef68);
    bVar14 = UniValue::exists((UniValue *)in_stack_ffffffffffffef30,
                              (string *)in_stack_ffffffffffffef28);
    if (bVar14) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffef78,(char *)in_stack_ffffffffffffef70,
                 (allocator<char> *)in_stack_ffffffffffffef68);
      UniValue::operator[]
                ((UniValue *)in_stack_ffffffffffffef38._M_node,(string *)in_stack_ffffffffffffef30);
      UniValue::get_str_abi_cxx11_((UniValue *)in_stack_ffffffffffffef30);
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffef70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffef68);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffef28);
      std::allocator<char>::~allocator(&local_a89);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffef78,(char *)in_stack_ffffffffffffef70,
                 (allocator<char> *)in_stack_ffffffffffffef68);
      std::allocator<char>::~allocator(&local_a8a);
    }
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffef28);
    std::allocator<char>::~allocator(&local_a88);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffef78,(char *)in_stack_ffffffffffffef70,
               (allocator<char> *)in_stack_ffffffffffffef68);
    bVar14 = UniValue::exists((UniValue *)in_stack_ffffffffffffef30,
                              (string *)in_stack_ffffffffffffef28);
    if (bVar14) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffef78,(char *)in_stack_ffffffffffffef70,
                 (allocator<char> *)in_stack_ffffffffffffef68);
      UniValue::operator[]
                ((UniValue *)in_stack_ffffffffffffef38._M_node,(string *)in_stack_ffffffffffffef30);
      UniValue::get_array((UniValue *)in_stack_ffffffffffffef30);
      UniValue::UniValue((UniValue *)in_stack_ffffffffffffef58._M_node,
                         (UniValue *)in_stack_ffffffffffffef50._M_node);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffef28);
      std::allocator<char>::~allocator(&local_a8c);
    }
    else {
      UniValue::UniValue((UniValue *)in_stack_ffffffffffffef28);
    }
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffef28);
    std::allocator<char>::~allocator(&local_a8b);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffef78,(char *)in_stack_ffffffffffffef70,
               (allocator<char> *)in_stack_ffffffffffffef68);
    bVar14 = UniValue::exists((UniValue *)in_stack_ffffffffffffef30,
                              (string *)in_stack_ffffffffffffef28);
    if (bVar14) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffef78,(char *)in_stack_ffffffffffffef70,
                 (allocator<char> *)in_stack_ffffffffffffef68);
      UniValue::operator[]
                ((UniValue *)in_stack_ffffffffffffef38._M_node,(string *)in_stack_ffffffffffffef30);
      UniValue::get_array((UniValue *)in_stack_ffffffffffffef30);
      UniValue::UniValue((UniValue *)in_stack_ffffffffffffef58._M_node,
                         (UniValue *)in_stack_ffffffffffffef50._M_node);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffef28);
      std::allocator<char>::~allocator(&local_a8e);
    }
    else {
      UniValue::UniValue((UniValue *)in_stack_ffffffffffffef28);
    }
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffef28);
    std::allocator<char>::~allocator(&local_a8d);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffef78,(char *)in_stack_ffffffffffffef70,
               (allocator<char> *)in_stack_ffffffffffffef68);
    uVar2 = UniValue::exists((UniValue *)in_stack_ffffffffffffef30,
                             (string *)in_stack_ffffffffffffef28);
    if ((bool)uVar2) {
      in_stack_fffffffffffff118 = &local_a91;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffef78,(char *)in_stack_ffffffffffffef70,
                 (allocator<char> *)in_stack_ffffffffffffef68);
      UniValue::operator[]
                ((UniValue *)in_stack_ffffffffffffef38._M_node,(string *)in_stack_ffffffffffffef30);
      local_efa = UniValue::get_bool((UniValue *)in_stack_ffffffffffffef30);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffef28);
      std::allocator<char>::~allocator(&local_a91);
    }
    else {
      local_efa = false;
    }
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffef28);
    std::allocator<char>::~allocator(&local_a90);
    internal = local_efa;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffef78,(char *)in_stack_ffffffffffffef70,
               (allocator<char> *)in_stack_ffffffffffffef68);
    bVar14 = UniValue::exists((UniValue *)in_stack_ffffffffffffef30,
                              (string *)in_stack_ffffffffffffef28);
    if (bVar14) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffef78,(char *)in_stack_ffffffffffffef70,
                 (allocator<char> *)in_stack_ffffffffffffef68);
      UniValue::operator[]
                ((UniValue *)in_stack_ffffffffffffef38._M_node,(string *)in_stack_ffffffffffffef30);
      local_f32 = UniValue::get_bool((UniValue *)in_stack_ffffffffffffef30);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffef28);
      std::allocator<char>::~allocator(&local_a93);
    }
    else {
      local_f32 = false;
    }
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffef28);
    std::allocator<char>::~allocator(&local_a92);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffef78,(char *)in_stack_ffffffffffffef70,
               (allocator<char> *)in_stack_ffffffffffffef68);
    bVar14 = UniValue::exists((UniValue *)in_stack_ffffffffffffef30,
                              (string *)in_stack_ffffffffffffef28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffef28);
    std::allocator<char>::~allocator(&local_a94);
    if (bVar14) {
      uVar5 = __cxa_allocate_exception(0x58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffef78,(char *)in_stack_ffffffffffffef70,
                 (allocator<char> *)in_stack_ffffffffffffef68);
      JSONRPCError((int)((ulong)in_stack_ffffffffffffef78 >> 0x20),
                   (string *)in_stack_ffffffffffffef68);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(uVar5,&UniValue::typeinfo,UniValue::~UniValue);
      }
    }
    else {
      CScript::CScript((CScript *)in_stack_ffffffffffffef28);
      if (bVar13) {
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffef48._M_current);
        str_00._M_str = (char *)in_stack_ffffffffffffef58._M_node;
        str_00._M_len = (size_t)in_stack_ffffffffffffef50._M_node;
        bVar14 = IsHex(str_00);
        if (!bVar14) {
          uVar5 = __cxa_allocate_exception(0x58);
          std::operator+((char *)in_stack_ffffffffffffef78,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffef70);
          iVar18 = (int)((ulong)in_stack_ffffffffffffef78 >> 0x20);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffef44,in_stack_ffffffffffffef40),
                         (char *)in_stack_ffffffffffffef38._M_node);
          JSONRPCError(iVar18,(string *)in_stack_ffffffffffffef68);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            __cxa_throw(uVar5,&UniValue::typeinfo,UniValue::~UniValue);
          }
          goto LAB_015e7b51;
        }
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffef48._M_current);
        hex_str._M_str = in_stack_ffffffffffffef98;
        hex_str._M_len = (size_t)in_stack_ffffffffffffef90;
        ParseHex<unsigned_char>(hex_str);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_ffffffffffffef30);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_ffffffffffffef30);
        last._M_current._4_4_ = in_stack_ffffffffffffef44;
        last._M_current._0_4_ = in_stack_ffffffffffffef40;
        CScript::
        CScript<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ((CScript *)in_stack_ffffffffffffef28,in_stack_ffffffffffffef48,last);
        CScript::operator=((CScript *)in_stack_ffffffffffffef38._M_node,
                           (CScript *)in_stack_ffffffffffffef30);
        CScript::~CScript((CScript *)in_stack_ffffffffffffef28);
        std::
        variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                   *)in_stack_ffffffffffffef28);
        bVar14 = ExtractDestination(in_stack_fffffffffffff018,in_stack_fffffffffffff010);
        if ((!bVar14) && ((internal & 1U) == 0)) {
          uVar5 = __cxa_allocate_exception(0x58);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffef78,(char *)in_stack_ffffffffffffef70,
                     (allocator<char> *)in_stack_ffffffffffffef68);
          JSONRPCError((int)((ulong)in_stack_ffffffffffffef78 >> 0x20),
                       (string *)in_stack_ffffffffffffef68);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            __cxa_throw(uVar5,&UniValue::typeinfo,UniValue::~UniValue);
          }
          goto LAB_015e7b51;
        }
        std::
        variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                    *)in_stack_ffffffffffffef28);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_ffffffffffffef38._M_node);
      }
      else {
        DecodeDestination((string *)in_stack_ffffffffffffef50._M_node);
        bVar14 = IsValidDestination((CTxDestination *)in_stack_ffffffffffffef30);
        if (!bVar14) {
          uVar5 = __cxa_allocate_exception(0x58);
          std::operator+((char *)in_stack_ffffffffffffef78,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffef70);
          iVar18 = (int)((ulong)in_stack_ffffffffffffef78 >> 0x20);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffef44,in_stack_ffffffffffffef40),
                         (char *)in_stack_ffffffffffffef38._M_node);
          JSONRPCError(iVar18,(string *)in_stack_ffffffffffffef68);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            __cxa_throw(uVar5,&UniValue::typeinfo,UniValue::~UniValue);
          }
          goto LAB_015e7b51;
        }
        local_a50 = (_Optional_payload_base<OutputType>)
                    OutputTypeFromDestination((CTxDestination *)in_stack_ffffffffffffef30);
        _Var3 = std::operator==((optional<OutputType> *)in_stack_ffffffffffffef38._M_node,
                                (OutputType *)in_stack_ffffffffffffef30);
        if (_Var3) {
          uVar5 = __cxa_allocate_exception(0x58);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffef78,(char *)in_stack_ffffffffffffef70,
                     (allocator<char> *)in_stack_ffffffffffffef68);
          JSONRPCError((int)((ulong)in_stack_ffffffffffffef78 >> 0x20),
                       (string *)in_stack_ffffffffffffef68);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            __cxa_throw(uVar5,&UniValue::typeinfo,UniValue::~UniValue);
          }
          goto LAB_015e7b51;
        }
        GetScriptForDestination((CTxDestination *)in_stack_ffffffffffffef28);
        CScript::operator=((CScript *)in_stack_ffffffffffffef38._M_node,
                           (CScript *)in_stack_ffffffffffffef30);
        CScript::~CScript((CScript *)in_stack_ffffffffffffef28);
        std::
        variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                    *)in_stack_ffffffffffffef28);
      }
      pVar15 = std::set<CScript,std::less<CScript>,std::allocator<CScript>>::emplace<CScript&>
                         ((set<CScript,_std::less<CScript>,_std::allocator<CScript>_> *)
                          in_stack_ffffffffffffef38._M_node,(CScript *)in_stack_ffffffffffffef30);
      local_a60 = (_Base_ptr)pVar15.first._M_node;
      local_a58 = pVar15.second;
      sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffef28);
      if (sVar6 != 0) {
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffef48._M_current);
        str_01._M_str = (char *)in_stack_ffffffffffffef58._M_node;
        str_01._M_len = (size_t)in_stack_ffffffffffffef50._M_node;
        bVar14 = IsHex(str_01);
        if (!bVar14) {
          uVar5 = __cxa_allocate_exception(0x58);
          std::operator+((char *)in_stack_ffffffffffffef78,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffef70);
          iVar18 = (int)((ulong)in_stack_ffffffffffffef78 >> 0x20);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffef44,in_stack_ffffffffffffef40),
                         (char *)in_stack_ffffffffffffef38._M_node);
          JSONRPCError(iVar18,(string *)in_stack_ffffffffffffef68);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            __cxa_throw(uVar5,&UniValue::typeinfo,UniValue::~UniValue);
          }
          goto LAB_015e7b51;
        }
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffef48._M_current);
        hex_str_00._M_str = in_stack_ffffffffffffef98;
        hex_str_00._M_len = (size_t)in_stack_ffffffffffffef90;
        ParseHex<unsigned_char>(hex_str_00);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_ffffffffffffef30);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_ffffffffffffef30);
        std::
        make_unique<CScript,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)in_stack_ffffffffffffef60,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)in_stack_ffffffffffffef58._M_node);
        std::unique_ptr<CScript,_std::default_delete<CScript>_>::operator=
                  ((unique_ptr<CScript,_std::default_delete<CScript>_> *)
                   in_stack_ffffffffffffef38._M_node,&in_stack_ffffffffffffef30->redeemscript);
        std::unique_ptr<CScript,_std::default_delete<CScript>_>::~unique_ptr
                  ((unique_ptr<CScript,_std::default_delete<CScript>_> *)
                   in_stack_ffffffffffffef38._M_node);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_ffffffffffffef38._M_node);
      }
      sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffef28);
      if (sVar6 != 0) {
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffef48._M_current);
        str_02._M_str = (char *)in_stack_ffffffffffffef58._M_node;
        str_02._M_len = (size_t)in_stack_ffffffffffffef50._M_node;
        bVar14 = IsHex(str_02);
        if (!bVar14) {
          uVar5 = __cxa_allocate_exception(0x58);
          std::operator+((char *)in_stack_ffffffffffffef78,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffef70);
          iVar18 = (int)((ulong)in_stack_ffffffffffffef78 >> 0x20);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffef44,in_stack_ffffffffffffef40),
                         (char *)in_stack_ffffffffffffef38._M_node);
          JSONRPCError(iVar18,(string *)in_stack_ffffffffffffef68);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            __cxa_throw(uVar5,&UniValue::typeinfo,UniValue::~UniValue);
          }
          goto LAB_015e7b51;
        }
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffef48._M_current);
        hex_str_01._M_str = in_stack_ffffffffffffef98;
        hex_str_01._M_len = (size_t)in_stack_ffffffffffffef90;
        ParseHex<unsigned_char>(hex_str_01);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_ffffffffffffef30);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_ffffffffffffef30);
        std::
        make_unique<CScript,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)in_stack_ffffffffffffef60,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)in_stack_ffffffffffffef58._M_node);
        std::unique_ptr<CScript,_std::default_delete<CScript>_>::operator=
                  ((unique_ptr<CScript,_std::default_delete<CScript>_> *)
                   in_stack_ffffffffffffef38._M_node,&in_stack_ffffffffffffef30->redeemscript);
        std::unique_ptr<CScript,_std::default_delete<CScript>_>::~unique_ptr
                  ((unique_ptr<CScript,_std::default_delete<CScript>_> *)
                   in_stack_ffffffffffffef38._M_node);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_ffffffffffffef38._M_node);
      }
      for (i = 0; sVar7 = UniValue::size((UniValue *)in_stack_ffffffffffffef28), i < sVar7;
          i = i + 1) {
        UniValue::operator[]
                  ((UniValue *)CONCAT44(in_stack_ffffffffffffef44,in_stack_ffffffffffffef40),
                   (size_t)in_stack_ffffffffffffef38._M_node);
        in_stack_ffffffffffffefe0 =
             UniValue::get_str_abi_cxx11_((UniValue *)in_stack_ffffffffffffef30);
        HexToPubKey(in_stack_ffffffffffffef90);
        CPubKey::GetID((CPubKey *)in_stack_ffffffffffffef50._M_node);
        pVar16 = std::
                 map<CKeyID,CPubKey,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
                 ::emplace<CKeyID,CPubKey&>
                           ((map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
                             *)in_stack_ffffffffffffef48._M_current,
                            (CKeyID *)CONCAT44(in_stack_ffffffffffffef44,in_stack_ffffffffffffef40),
                            (CPubKey *)in_stack_ffffffffffffef38._M_node);
        local_a70 = (_Base_ptr)pVar16.first._M_node;
        local_a68 = pVar16.second;
        CPubKey::GetID((CPubKey *)in_stack_ffffffffffffef50._M_node);
        std::vector<std::pair<CKeyID,bool>,std::allocator<std::pair<CKeyID,bool>>>::
        emplace_back<CKeyID,bool_const&>
                  ((vector<std::pair<CKeyID,_bool>,_std::allocator<std::pair<CKeyID,_bool>_>_> *)
                   in_stack_ffffffffffffef48._M_current,
                   (CKeyID *)CONCAT44(in_stack_ffffffffffffef44,in_stack_ffffffffffffef40),
                   (bool *)in_stack_ffffffffffffef38._M_node);
      }
      i_1 = 0;
      while( true ) {
        sVar7 = i_1;
        sVar8 = UniValue::size((UniValue *)in_stack_ffffffffffffef28);
        script_ctx = (ScriptContext)((ulong)in_stack_fffffffffffff118 >> 0x20);
        if (sVar8 <= sVar7) break;
        in_stack_ffffffffffffefb0 =
             UniValue::operator[]
                       ((UniValue *)CONCAT44(in_stack_ffffffffffffef44,in_stack_ffffffffffffef40),
                        (size_t)in_stack_ffffffffffffef38._M_node);
        UniValue::get_str_abi_cxx11_((UniValue *)in_stack_ffffffffffffef30);
        DecodeSecret(in_stack_ffffffffffffefe0);
        bVar14 = CKey::IsValid((CKey *)in_stack_ffffffffffffef28);
        if (!bVar14) {
          uVar5 = __cxa_allocate_exception(0x58);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffef78,(char *)in_stack_ffffffffffffef70,
                     (allocator<char> *)in_stack_ffffffffffffef68);
          JSONRPCError((int)((ulong)in_stack_ffffffffffffef78 >> 0x20),
                       (string *)in_stack_ffffffffffffef68);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            __cxa_throw(uVar5,&UniValue::typeinfo,UniValue::~UniValue);
          }
          goto LAB_015e7b51;
        }
        CKey::GetPubKey((CKey *)in_stack_ffffffffffffef50._M_node);
        CPubKey::GetID((CPubKey *)in_stack_ffffffffffffef50._M_node);
        sVar9 = std::
                map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
                ::count((map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
                         *)in_stack_ffffffffffffef38._M_node,(key_type *)in_stack_ffffffffffffef30);
        if (sVar9 != 0) {
          std::
          map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
          ::erase((map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
                   *)in_stack_ffffffffffffef38._M_node,(key_type *)in_stack_ffffffffffffef30);
        }
        pVar17 = std::
                 map<CKeyID,CKey,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CKey>>>::
                 emplace<CKeyID&,CKey&>
                           ((map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                             *)in_stack_ffffffffffffef48._M_current,
                            (CKeyID *)CONCAT44(in_stack_ffffffffffffef44,in_stack_ffffffffffffef40),
                            (CKey *)in_stack_ffffffffffffef38._M_node);
        local_a80 = (_Base_ptr)pVar17.first._M_node;
        local_a78 = pVar17.second;
        CKey::~CKey((CKey *)in_stack_ffffffffffffef28);
        i_1 = i_1 + 1;
      }
      bVar14 = std::unique_ptr::operator_cast_to_bool(&in_stack_ffffffffffffef28->redeemscript);
      local_107a = true;
      if (!bVar14) {
        bVar14 = std::unique_ptr::operator_cast_to_bool(&in_stack_ffffffffffffef28->redeemscript);
        local_107a = true;
        if (!bVar14) {
          sVar9 = std::
                  map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
                  ::size((map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
                          *)in_stack_ffffffffffffef28);
          local_107a = true;
          if (sVar9 == 0) {
            sVar10 = std::
                     map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                     ::size((map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                             *)in_stack_ffffffffffffef28);
            local_107a = sVar10 != 0;
          }
        }
      }
      *have_solving_data = local_107a;
      if ((*have_solving_data & 1U) != 0) {
        RecurseImportData_abi_cxx11_
                  ((CScript *)data,(ImportData *)CONCAT17(uVar2,in_stack_fffffffffffff120),
                   script_ctx);
        std::map<CKeyID,_bool,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_bool>_>_>::
        begin((map<CKeyID,_bool,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_bool>_>_>
               *)in_stack_ffffffffffffef30);
        std::map<CKeyID,_bool,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_bool>_>_>::
        end((map<CKeyID,_bool,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_bool>_>_> *
            )in_stack_ffffffffffffef30);
        bVar14 = std::
                 all_of<std::_Rb_tree_iterator<std::pair<CKeyID_const,bool>>,wallet::ProcessImportLegacy(wallet::ImportData&,std::map<CKeyID,CPubKey,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>&,std::map<CKeyID,CKey,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CKey>>>&,std::set<CScript,std::less<CScript>,std::allocator<CScript>>&,bool&,UniValue_const&,std::vector<std::pair<CKeyID,bool>,std::allocator<std::pair<CKeyID,bool>>>&)::__0>
                           (in_stack_ffffffffffffef58,in_stack_ffffffffffffef50,
                            (anon_class_8_1_7f99e04d)in_stack_ffffffffffffef48._M_current);
        if ((local_f32 == false) && (!bVar14)) {
          UniValue::UniValue<const_char_(&)[121],_char[121],_true>
                    (in_stack_ffffffffffffef70,(char (*) [121])in_stack_ffffffffffffef68);
          UniValue::push_back((UniValue *)
                              CONCAT44(in_stack_ffffffffffffef44,in_stack_ffffffffffffef40),
                              (UniValue *)in_stack_ffffffffffffef38._M_node);
          UniValue::~UniValue((UniValue *)in_stack_ffffffffffffef28);
        }
        if ((local_f32 != false) && (bVar14)) {
          UniValue::UniValue<const_char_(&)[128],_char[128],_true>
                    (in_stack_ffffffffffffef70,(char (*) [128])in_stack_ffffffffffffef68);
          UniValue::push_back((UniValue *)
                              CONCAT44(in_stack_ffffffffffffef44,in_stack_ffffffffffffef40),
                              (UniValue *)in_stack_ffffffffffffef38._M_node);
          UniValue::~UniValue((UniValue *)in_stack_ffffffffffffef28);
        }
        bVar14 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffef28);
        if (bVar14) {
          std::map<CKeyID,_bool,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_bool>_>_>
          ::begin((map<CKeyID,_bool,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_bool>_>_>
                   *)in_stack_ffffffffffffef30);
          std::map<CKeyID,_bool,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_bool>_>_>
          ::end((map<CKeyID,_bool,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_bool>_>_>
                 *)in_stack_ffffffffffffef30);
          while (bVar14 = std::operator==((_Self *)in_stack_ffffffffffffef38._M_node,
                                          (_Self *)in_stack_ffffffffffffef30),
                ((bVar14 ^ 0xffU) & 1) != 0) {
            ppVar11 = std::_Rb_tree_iterator<std::pair<const_CKeyID,_bool>_>::operator*
                                ((_Rb_tree_iterator<std::pair<const_CKeyID,_bool>_> *)
                                 in_stack_ffffffffffffef28);
            if ((((ppVar11->second & 1U) != 0) &&
                (in_stack_ffffffffffffef78 =
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      std::
                      map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
                      ::count((map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
                               *)in_stack_ffffffffffffef38._M_node,
                              (key_type *)in_stack_ffffffffffffef30),
                in_stack_ffffffffffffef78 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) &&
               (in_stack_ffffffffffffef70 =
                     (UniValue *)
                     std::
                     map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                     ::count((map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                              *)in_stack_ffffffffffffef38._M_node,
                             (key_type *)in_stack_ffffffffffffef30),
               in_stack_ffffffffffffef70 == (UniValue *)0x0)) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_ffffffffffffef38._M_node,(char *)in_stack_ffffffffffffef30);
            }
            std::_Rb_tree_iterator<std::pair<const_CKeyID,_bool>_>::operator++
                      ((_Rb_tree_iterator<std::pair<const_CKeyID,_bool>_> *)
                       in_stack_ffffffffffffef28);
          }
        }
        bVar14 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffef28);
        if (bVar14) {
          bVar14 = std::unique_ptr::operator_cast_to_bool(&in_stack_ffffffffffffef28->redeemscript);
          if (bVar14) {
            UniValue::UniValue<const_char_(&)[52],_char[52],_true>
                      (in_stack_ffffffffffffef70,(char (*) [52])in_stack_ffffffffffffef68);
            UniValue::push_back((UniValue *)
                                CONCAT44(in_stack_ffffffffffffef44,in_stack_ffffffffffffef40),
                                (UniValue *)in_stack_ffffffffffffef38._M_node);
            UniValue::~UniValue((UniValue *)in_stack_ffffffffffffef28);
          }
          bVar14 = std::unique_ptr::operator_cast_to_bool(&in_stack_ffffffffffffef28->redeemscript);
          if (bVar14) {
            UniValue::UniValue<const_char_(&)[61],_char[61],_true>
                      (in_stack_ffffffffffffef70,(char (*) [61])in_stack_ffffffffffffef68);
            UniValue::push_back((UniValue *)
                                CONCAT44(in_stack_ffffffffffffef44,in_stack_ffffffffffffef40),
                                (UniValue *)in_stack_ffffffffffffef38._M_node);
            UniValue::~UniValue((UniValue *)in_stack_ffffffffffffef28);
          }
          std::map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
          ::begin((map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                   *)in_stack_ffffffffffffef30);
          while( true ) {
            std::
            map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>::
            end((map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                 *)in_stack_ffffffffffffef30);
            bVar14 = std::operator==((_Self *)in_stack_ffffffffffffef38._M_node,
                                     (_Self *)in_stack_ffffffffffffef30);
            if (((bVar14 ^ 0xffU) & 1) == 0) break;
            std::_Rb_tree_iterator<std::pair<const_CKeyID,_CKey>_>::operator++
                      ((_Rb_tree_iterator<std::pair<const_CKeyID,_CKey>_> *)
                       CONCAT44(in_stack_ffffffffffffef44,in_stack_ffffffffffffef40),
                       (int)((ulong)in_stack_ffffffffffffef38._M_node >> 0x20));
            in_stack_ffffffffffffef60 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &import_data->used_keys;
            std::_Rb_tree_iterator<std::pair<const_CKeyID,_CKey>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_CKeyID,_CKey>_> *)
                       in_stack_ffffffffffffef28);
            in_stack_ffffffffffffef68 =
                 (UniValue *)
                 std::
                 map<CKeyID,_bool,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_bool>_>_>
                 ::count((map<CKeyID,_bool,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_bool>_>_>
                          *)in_stack_ffffffffffffef38._M_node,(key_type *)in_stack_ffffffffffffef30)
            ;
            if (in_stack_ffffffffffffef68 == (UniValue *)0x0) {
              UniValue::UniValue<const_char_(&)[33],_char[33],_true>
                        (in_stack_ffffffffffffef70,(char (*) [33])0x0);
              UniValue::push_back((UniValue *)
                                  CONCAT44(in_stack_ffffffffffffef44,in_stack_ffffffffffffef40),
                                  (UniValue *)in_stack_ffffffffffffef38._M_node);
              UniValue::~UniValue((UniValue *)in_stack_ffffffffffffef28);
              std::map<CKeyID,CKey,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CKey>>>::
              erase_abi_cxx11_((map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                                *)in_stack_ffffffffffffef30,
                               (iterator)in_stack_ffffffffffffef48._M_current);
            }
          }
          std::
          map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
          ::begin((map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
                   *)in_stack_ffffffffffffef30);
          while( true ) {
            std::
            map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
            ::end((map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
                   *)in_stack_ffffffffffffef30);
            bVar14 = std::operator==((_Self *)in_stack_ffffffffffffef38._M_node,
                                     (_Self *)in_stack_ffffffffffffef30);
            if (((bVar14 ^ 0xffU) & 1) == 0) break;
            std::_Rb_tree_iterator<std::pair<const_CKeyID,_CPubKey>_>::operator++
                      ((_Rb_tree_iterator<std::pair<const_CKeyID,_CPubKey>_> *)
                       CONCAT44(in_stack_ffffffffffffef44,in_stack_ffffffffffffef40),
                       (int)((ulong)in_stack_ffffffffffffef38._M_node >> 0x20));
            __position._M_node = (_Base_ptr)&import_data->used_keys;
            std::_Rb_tree_iterator<std::pair<const_CKeyID,_CPubKey>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_CKeyID,_CPubKey>_> *)
                       in_stack_ffffffffffffef28);
            std::
            map<CKeyID,_bool,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_bool>_>_>::
            find((map<CKeyID,_bool,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_bool>_>_>
                  *)in_stack_ffffffffffffef30,(key_type *)in_stack_ffffffffffffef28);
            std::
            map<CKeyID,_bool,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_bool>_>_>::
            end((map<CKeyID,_bool,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_bool>_>_>
                 *)in_stack_ffffffffffffef30);
            bVar14 = std::operator==((_Self *)in_stack_ffffffffffffef38._M_node,
                                     (_Self *)in_stack_ffffffffffffef30);
            in_stack_ffffffffffffef44 = CONCAT13(1,(int3)in_stack_ffffffffffffef44);
            if (!bVar14) {
              ppVar12 = std::_Rb_tree_iterator<std::pair<const_CKeyID,_bool>_>::operator->
                                  ((_Rb_tree_iterator<std::pair<const_CKeyID,_bool>_> *)
                                   in_stack_ffffffffffffef28);
              in_stack_ffffffffffffef44 =
                   CONCAT13(ppVar12->second,(int3)in_stack_ffffffffffffef44) ^ 0xff000000;
            }
            if ((in_stack_ffffffffffffef44 & 0x1000000) != VNULL) {
              std::_Rb_tree_iterator<std::pair<const_CKeyID,_CPubKey>_>::operator->
                        ((_Rb_tree_iterator<std::pair<const_CKeyID,_CPubKey>_> *)
                         in_stack_ffffffffffffef28);
              Span<const_unsigned_char>::Span<CKeyID>
                        ((Span<const_unsigned_char> *)in_stack_ffffffffffffef38._M_node,
                         (CKeyID *)in_stack_ffffffffffffef30,in_stack_ffffffffffffef28);
              s.m_size = sVar7;
              s.m_data = (uchar *)in_stack_ffffffffffffefb0;
              HexStr_abi_cxx11_(s);
              std::operator+((char *)CONCAT44(in_stack_ffffffffffffef44,in_stack_ffffffffffffef40),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffef38._M_node);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_ffffffffffffef44,in_stack_ffffffffffffef40),
                             (char *)in_stack_ffffffffffffef38._M_node);
              UniValue::
              UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        (in_stack_ffffffffffffef68,in_stack_ffffffffffffef60);
              UniValue::push_back((UniValue *)
                                  CONCAT44(in_stack_ffffffffffffef44,in_stack_ffffffffffffef40),
                                  (UniValue *)in_stack_ffffffffffffef38._M_node);
              UniValue::~UniValue((UniValue *)in_stack_ffffffffffffef28);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffef28);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffef28);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffef28);
              in_stack_ffffffffffffef38 =
                   std::
                   map<CKeyID,CPubKey,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
                   ::erase_abi_cxx11_((map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
                                       *)in_stack_ffffffffffffef30,__position);
            }
          }
        }
        else {
          std::operator+((char *)in_stack_ffffffffffffef78,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffef70);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffef44,in_stack_ffffffffffffef40),
                         (char *)in_stack_ffffffffffffef38._M_node);
          UniValue::
          UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    (in_stack_ffffffffffffef68,in_stack_ffffffffffffef60);
          UniValue::push_back((UniValue *)
                              CONCAT44(in_stack_ffffffffffffef44,in_stack_ffffffffffffef40),
                              (UniValue *)in_stack_ffffffffffffef38._M_node);
          UniValue::~UniValue((UniValue *)in_stack_ffffffffffffef28);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffef28);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffef28);
          memset(local_888,0,0xa0);
          ImportData::ImportData(in_stack_ffffffffffffef28);
          ImportData::operator=
                    ((ImportData *)in_stack_ffffffffffffef38._M_node,in_stack_ffffffffffffef30);
          ImportData::~ImportData(in_stack_ffffffffffffef28);
          std::
          map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
          ::clear((map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
                   *)in_stack_ffffffffffffef28);
          std::map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
          ::clear((map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                   *)in_stack_ffffffffffffef28);
          *have_solving_data = false;
        }
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffef28);
      }
      CScript::~CScript((CScript *)in_stack_ffffffffffffef28);
      UniValue::~UniValue((UniValue *)in_stack_ffffffffffffef28);
      UniValue::~UniValue((UniValue *)in_stack_ffffffffffffef28);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffef28);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffef28);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return __return_storage_ptr__;
      }
    }
  }
  else {
    uVar5 = __cxa_allocate_exception(0x58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffef78,(char *)in_stack_ffffffffffffef70,
               (allocator<char> *)in_stack_ffffffffffffef68);
    JSONRPCError((int)((ulong)in_stack_ffffffffffffef78 >> 0x20),(string *)in_stack_ffffffffffffef68
                );
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(uVar5,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
LAB_015e7b51:
  __stack_chk_fail();
}

Assistant:

static UniValue ProcessImportLegacy(ImportData& import_data, std::map<CKeyID, CPubKey>& pubkey_map, std::map<CKeyID, CKey>& privkey_map, std::set<CScript>& script_pub_keys, bool& have_solving_data, const UniValue& data, std::vector<std::pair<CKeyID, bool>>& ordered_pubkeys)
{
    UniValue warnings(UniValue::VARR);

    // First ensure scriptPubKey has either a script or JSON with "address" string
    const UniValue& scriptPubKey = data["scriptPubKey"];
    bool isScript = scriptPubKey.getType() == UniValue::VSTR;
    if (!isScript && !(scriptPubKey.getType() == UniValue::VOBJ && scriptPubKey.exists("address"))) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "scriptPubKey must be string with script or JSON with address string");
    }
    const std::string& output = isScript ? scriptPubKey.get_str() : scriptPubKey["address"].get_str();

    // Optional fields.
    const std::string& strRedeemScript = data.exists("redeemscript") ? data["redeemscript"].get_str() : "";
    const std::string& witness_script_hex = data.exists("witnessscript") ? data["witnessscript"].get_str() : "";
    const UniValue& pubKeys = data.exists("pubkeys") ? data["pubkeys"].get_array() : UniValue();
    const UniValue& keys = data.exists("keys") ? data["keys"].get_array() : UniValue();
    const bool internal = data.exists("internal") ? data["internal"].get_bool() : false;
    const bool watchOnly = data.exists("watchonly") ? data["watchonly"].get_bool() : false;

    if (data.exists("range")) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Range should not be specified for a non-descriptor import");
    }

    // Generate the script and destination for the scriptPubKey provided
    CScript script;
    if (!isScript) {
        CTxDestination dest = DecodeDestination(output);
        if (!IsValidDestination(dest)) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Invalid address \"" + output + "\"");
        }
        if (OutputTypeFromDestination(dest) == OutputType::BECH32M) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Bech32m addresses cannot be imported into legacy wallets");
        }
        script = GetScriptForDestination(dest);
    } else {
        if (!IsHex(output)) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Invalid scriptPubKey \"" + output + "\"");
        }
        std::vector<unsigned char> vData(ParseHex(output));
        script = CScript(vData.begin(), vData.end());
        CTxDestination dest;
        if (!ExtractDestination(script, dest) && !internal) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Internal must be set to true for nonstandard scriptPubKey imports.");
        }
    }
    script_pub_keys.emplace(script);

    // Parse all arguments
    if (strRedeemScript.size()) {
        if (!IsHex(strRedeemScript)) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Invalid redeem script \"" + strRedeemScript + "\": must be hex string");
        }
        auto parsed_redeemscript = ParseHex(strRedeemScript);
        import_data.redeemscript = std::make_unique<CScript>(parsed_redeemscript.begin(), parsed_redeemscript.end());
    }
    if (witness_script_hex.size()) {
        if (!IsHex(witness_script_hex)) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Invalid witness script \"" + witness_script_hex + "\": must be hex string");
        }
        auto parsed_witnessscript = ParseHex(witness_script_hex);
        import_data.witnessscript = std::make_unique<CScript>(parsed_witnessscript.begin(), parsed_witnessscript.end());
    }
    for (size_t i = 0; i < pubKeys.size(); ++i) {
        CPubKey pubkey = HexToPubKey(pubKeys[i].get_str());
        pubkey_map.emplace(pubkey.GetID(), pubkey);
        ordered_pubkeys.emplace_back(pubkey.GetID(), internal);
    }
    for (size_t i = 0; i < keys.size(); ++i) {
        const auto& str = keys[i].get_str();
        CKey key = DecodeSecret(str);
        if (!key.IsValid()) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Invalid private key encoding");
        }
        CPubKey pubkey = key.GetPubKey();
        CKeyID id = pubkey.GetID();
        if (pubkey_map.count(id)) {
            pubkey_map.erase(id);
        }
        privkey_map.emplace(id, key);
    }


    // Verify and process input data
    have_solving_data = import_data.redeemscript || import_data.witnessscript || pubkey_map.size() || privkey_map.size();
    if (have_solving_data) {
        // Match up data in import_data with the scriptPubKey in script.
        auto error = RecurseImportData(script, import_data, ScriptContext::TOP);

        // Verify whether the watchonly option corresponds to the availability of private keys.
        bool spendable = std::all_of(import_data.used_keys.begin(), import_data.used_keys.end(), [&](const std::pair<CKeyID, bool>& used_key){ return privkey_map.count(used_key.first) > 0; });
        if (!watchOnly && !spendable) {
            warnings.push_back("Some private keys are missing, outputs will be considered watchonly. If this is intentional, specify the watchonly flag.");
        }
        if (watchOnly && spendable) {
            warnings.push_back("All private keys are provided, outputs will be considered spendable. If this is intentional, do not specify the watchonly flag.");
        }

        // Check that all required keys for solvability are provided.
        if (error.empty()) {
            for (const auto& require_key : import_data.used_keys) {
                if (!require_key.second) continue; // Not a required key
                if (pubkey_map.count(require_key.first) == 0 && privkey_map.count(require_key.first) == 0) {
                    error = "some required keys are missing";
                }
            }
        }

        if (!error.empty()) {
            warnings.push_back("Importing as non-solvable: " + error + ". If this is intentional, don't provide any keys, pubkeys, witnessscript, or redeemscript.");
            import_data = ImportData();
            pubkey_map.clear();
            privkey_map.clear();
            have_solving_data = false;
        } else {
            // RecurseImportData() removes any relevant redeemscript/witnessscript from import_data, so we can use that to discover if a superfluous one was provided.
            if (import_data.redeemscript) warnings.push_back("Ignoring redeemscript as this is not a P2SH script.");
            if (import_data.witnessscript) warnings.push_back("Ignoring witnessscript as this is not a (P2SH-)P2WSH script.");
            for (auto it = privkey_map.begin(); it != privkey_map.end(); ) {
                auto oldit = it++;
                if (import_data.used_keys.count(oldit->first) == 0) {
                    warnings.push_back("Ignoring irrelevant private key.");
                    privkey_map.erase(oldit);
                }
            }
            for (auto it = pubkey_map.begin(); it != pubkey_map.end(); ) {
                auto oldit = it++;
                auto key_data_it = import_data.used_keys.find(oldit->first);
                if (key_data_it == import_data.used_keys.end() || !key_data_it->second) {
                    warnings.push_back("Ignoring public key \"" + HexStr(oldit->first) + "\" as it doesn't appear inside P2PKH or P2WPKH.");
                    pubkey_map.erase(oldit);
                }
            }
        }
    }

    return warnings;
}